

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O0

void __thiscall merlin::cte::update(cte *this)

{
  edge *peVar1;
  bool bVar2;
  node *pnVar3;
  reference ppeVar4;
  size_type sVar5;
  reference pvVar6;
  factor *F;
  reference pvVar7;
  value __x;
  double dVar8;
  variable_set local_f8;
  factor local_c0;
  undefined1 local_60 [8];
  variable VX;
  node *cl_1;
  size_t ci;
  size_t v;
  edge *e;
  __normal_iterator<merlin::detail::edge_**,_std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>_>
  local_28;
  iterator ei;
  node *cl;
  size_t i;
  cte *this_local;
  
  cl = (node *)0x0;
  while( true ) {
    pnVar3 = (node *)std::vector<merlin::detail::node,_std::allocator<merlin::detail::node>_>::size
                               (&this->m_clusters);
    if (pnVar3 <= cl) break;
    ei._M_current =
         (edge **)std::vector<merlin::detail::node,_std::allocator<merlin::detail::node>_>::
                  operator[](&this->m_clusters,(size_type)cl);
    factor::operator=(&((reference)ei._M_current)->belief,&((reference)ei._M_current)->theta);
    local_28._M_current =
         (edge **)std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::
                  begin((vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_> *)
                        (ei._M_current + 0x28));
    while( true ) {
      e = (edge *)std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::end
                            ((vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>
                              *)(ei._M_current + 0x28));
      bVar2 = __gnu_cxx::operator!=
                        (&local_28,
                         (__normal_iterator<merlin::detail::edge_**,_std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>_>
                          *)&e);
      if (!bVar2) break;
      ppeVar4 = __gnu_cxx::
                __normal_iterator<merlin::detail::edge_**,_std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>_>
                ::operator*(&local_28);
      peVar1 = *ppeVar4;
      if ((edge *)peVar1->second->id == *ei._M_current) {
        factor::operator*=((factor *)(ei._M_current + 0x1c),&peVar1->fwd);
      }
      if ((edge *)peVar1->first->id == *ei._M_current) {
        factor::operator*=((factor *)(ei._M_current + 0x1c),&peVar1->bwd);
      }
      __gnu_cxx::
      __normal_iterator<merlin::detail::edge_**,_std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>_>
      ::operator++(&local_28);
    }
    cl = (node *)((long)&cl->id + 1);
  }
  __x = factor::sum(&this->m_root->belief);
  dVar8 = ::log(__x);
  this->m_logz = dVar8;
  ci = 0;
  while( true ) {
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->m_var2clique);
    if (sVar5 <= ci) break;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_var2clique,ci);
    VX.m_states = (size_t)std::vector<merlin::detail::node,_std::allocator<merlin::detail::node>_>::
                          operator[](&this->m_clusters,(long)*pvVar6);
    _local_60 = graphical_model::var(&this->m_gmo,ci);
    F = (factor *)(VX.m_states + 0xe0);
    variable_set::variable_set(&local_f8,(variable *)local_60);
    marg(&local_c0,this,F,&local_f8);
    pvVar7 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                       (&this->m_beliefs,ci);
    factor::operator=(pvVar7,&local_c0);
    factor::~factor(&local_c0);
    variable_set::~variable_set(&local_f8);
    pvVar7 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                       (&this->m_beliefs,ci);
    factor::normalize(pvVar7);
    ci = ci + 1;
  }
  return;
}

Assistant:

void cte::update() {

	// Compute the clique beliefs
	for (size_t i = 0; i < m_clusters.size(); ++i) {
		detail::node& cl = m_clusters[i];
		cl.belief = cl.theta;
		for (std::vector<detail::edge*>::iterator ei = cl.edges.begin();
				ei != cl.edges.end(); ++ei) {
			detail::edge* e = (*ei);
			if (e->second->id == cl.id) {
				cl.belief *= e->fwd;
			}
			if (e->first->id == cl.id) {
				cl.belief *= e->bwd;
			}
		}
	}

	// Compute the log partition function
	m_logz = std::log(m_root->belief.sum());

	// Compute the marginals
	for (size_t v = 0; v < m_var2clique.size(); ++v) {
		size_t ci = m_var2clique[v];
		detail::node& cl = m_clusters[ci];
		variable VX = m_gmo.var(v);

		m_beliefs[v] = marg(cl.belief, VX);
		m_beliefs[v].normalize(); // normalize
	}
}